

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

void gjkepa2_impl::Initialize
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,sResults *results,tShape *shape,bool withmargins)

{
  code *pcVar1;
  cbtTransform local_68;
  
  results->witnesses[1].m_floats[3] = 0.0;
  results->status = Separated;
  results->witnesses[0].m_floats[0] = 0.0;
  results->witnesses[0].m_floats[1] = 0.0;
  results->witnesses[0].m_floats[2] = 0.0;
  *(undefined8 *)(results->witnesses[0].m_floats + 3) = 0;
  results->witnesses[1].m_floats[1] = 0.0;
  results->witnesses[1].m_floats[2] = 0.0;
  shape->m_shapes[0] = shape0;
  shape->m_shapes[1] = shape1;
  cbtMatrix3x3::transposeTimes(&wtrs1->m_basis,&wtrs0->m_basis);
  *(undefined8 *)(shape->m_toshape1).m_el[0].m_floats = local_68.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape1).m_el[0].m_floats + 2) =
       local_68.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(shape->m_toshape1).m_el[1].m_floats = local_68.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape1).m_el[1].m_floats + 2) =
       local_68.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(shape->m_toshape1).m_el[2].m_floats = local_68.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape1).m_el[2].m_floats + 2) =
       local_68.m_basis.m_el[2].m_floats._8_8_;
  cbtTransform::inverseTimes(&local_68,wtrs0,wtrs1);
  *(undefined8 *)(shape->m_toshape0).m_basis.m_el[0].m_floats =
       local_68.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape0).m_basis.m_el[0].m_floats + 2) =
       local_68.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(shape->m_toshape0).m_basis.m_el[1].m_floats =
       local_68.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape0).m_basis.m_el[1].m_floats + 2) =
       local_68.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(shape->m_toshape0).m_basis.m_el[2].m_floats =
       local_68.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape0).m_basis.m_el[2].m_floats + 2) =
       local_68.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(shape->m_toshape0).m_origin.m_floats = local_68.m_origin.m_floats._0_8_;
  *(undefined8 *)((shape->m_toshape0).m_origin.m_floats + 2) = local_68.m_origin.m_floats._8_8_;
  if (withmargins) {
    pcVar1 = cbtConvexShape::localGetSupportVertexNonVirtual;
  }
  else {
    pcVar1 = cbtConvexShape::localGetSupportVertexWithoutMarginNonVirtual;
  }
  shape->Ls = (offset_in_cbtConvexShape_to_subr)pcVar1;
  *(undefined8 *)&shape->field_0x88 = 0;
  return;
}

Assistant:

static void Initialize(const cbtConvexShape* shape0, const cbtTransform& wtrs0,
					   const cbtConvexShape* shape1, const cbtTransform& wtrs1,
					   cbtGjkEpaSolver2::sResults& results,
					   tShape& shape,
					   bool withmargins)
{
	/* Results		*/
	results.witnesses[0] =
		results.witnesses[1] = cbtVector3(0, 0, 0);
	results.status = cbtGjkEpaSolver2::sResults::Separated;
	/* Shape		*/
	shape.m_shapes[0] = shape0;
	shape.m_shapes[1] = shape1;
	shape.m_toshape1 = wtrs1.getBasis().transposeTimes(wtrs0.getBasis());
	shape.m_toshape0 = wtrs0.inverseTimes(wtrs1);
	shape.EnableMargin(withmargins);
}